

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

void __thiscall
program_options::command_line_parser::command_line_parser
          (command_line_parser *this,int argc,char **argv)

{
  char *pcVar1;
  reference this_00;
  undefined8 *in_RDX;
  int in_ESI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffdc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x130211);
  in_RDI[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  if (0 < in_ESI) {
    std::__cxx11::string::operator=((string *)(in_RDI + 2),(char *)*in_RDX);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (iVar2 = 0; iVar2 < in_ESI + -1; iVar2 = iVar2 + 1) {
    pcVar1 = (char *)in_RDX[(long)iVar2 + 1];
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](in_RDI,(long)iVar2);
    std::__cxx11::string::operator=((string *)this_00,pcVar1);
  }
  *(undefined4 *)
   &in_RDI[1].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0x3f7;
  *(undefined1 *)
   ((long)&in_RDI[1].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

command_line_parser::command_line_parser(int argc, const char* const argv[]) {
    if (argc > 0) {
        m_executableName = argv[0];
    }

    m_rawArguments.resize(argc-1);
    for (int i = 0; i < argc-1; i++) {
        m_rawArguments[i] = argv[i+1];
    }

    m_style = command_line_style::default_style;
    m_allow_unregistered = false;
}